

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O2

void __thiscall
GraphicBoard::createTilesFromImage
          (GraphicBoard *this,QImage *sourceImage,BoardSize boardSize,size_t tileSize,
          GraphicMode graphicMode)

{
  size_t boardSize_00;
  int iVar1;
  TileSize TVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  long lVar5;
  QImage boardImage;
  QImage aQStack_68 [28];
  BoardSize local_4c;
  QImage local_48 [24];
  
  local_4c = boardSize;
  pmVar3 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_4c);
  boardSize_00 = *pmVar3;
  lVar5 = boardSize_00 * tileSize;
  QImage::QImage(aQStack_68);
  if (graphicMode == SCALED) {
    iVar1 = (int)lVar5;
    QImage::scaled(local_48,(int)sourceImage,iVar1,iVar1,FastTransformation);
  }
  else {
    iVar1 = QImage::width();
    QImage::height();
    QImage::copy(local_48,(EVP_PKEY_CTX *)sourceImage,(EVP_PKEY_CTX *)((ulong)(iVar1 - lVar5) >> 1))
    ;
  }
  QImage::operator=(aQStack_68,local_48);
  QImage::~QImage(local_48);
  createTiles(this,aQStack_68,boardSize_00,tileSize);
  TVar2 = Maps::getTileSizeByInt(tileSize);
  this->tileSize = TVar2;
  pmVar4 = std::
           map<TileSize,_FontSize,_std::less<TileSize>,_std::allocator<std::pair<const_TileSize,_FontSize>_>_>
           ::at(&Maps::tileSizeFontSize,&this->tileSize);
  this->fontSize = *pmVar4;
  QImage::~QImage(aQStack_68);
  return;
}

Assistant:

void GraphicBoard::createTilesFromImage( QImage& sourceImage, BoardSize boardSize, size_t tileSize, GraphicMode graphicMode )
{
    size_t boardSizeInt = Maps::boardSizeInt.at( boardSize );
    size_t boardSizePixel = boardSizeInt * tileSize;

    QImage boardImage;
    if ( graphicMode == GraphicMode::SCALED )
    {
        boardImage = sourceImage.scaled( boardSizePixel, boardSizePixel );
    }
    else
    {
        boardImage = sourceImage.copy(( sourceImage.width() - boardSizePixel ) / 2,
                                      ( sourceImage.height() - boardSizePixel ) / 2,
                                        boardSizePixel,
                                        boardSizePixel );
    }

    createTiles( boardImage, boardSizeInt, tileSize );
    this->tileSize = Maps::getTileSizeByInt( tileSize );
    this->fontSize = Maps::tileSizeFontSize.at( this->tileSize );
}